

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int evp_decodeblock_int(EVP_ENCODE_CTX *ctx,uchar *t,uchar *f,int n)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int in_ECX;
  uchar *puVar6;
  uchar *in_RDX;
  byte *pbVar7;
  byte *in_RSI;
  long in_RDI;
  bool bVar8;
  uchar *table;
  unsigned_long l;
  int d;
  int c;
  int b;
  int a;
  int ret;
  int i;
  uchar *local_50;
  int local_2c;
  int local_28;
  int local_24;
  uchar *local_20;
  byte *local_18;
  int local_4;
  
  local_2c = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  if ((in_RDI == 0) || ((*(uint *)(in_RDI + 0x5c) & 2) == 0)) {
    local_50 = data_ascii2bin;
  }
  else {
    local_50 = srpdata_ascii2bin;
  }
  while( true ) {
    bVar8 = false;
    if (0 < local_24) {
      uVar1 = conv_ascii2bin(*local_20,local_50);
      bVar8 = uVar1 == 0xe0;
    }
    if (!bVar8) break;
    local_20 = local_20 + 1;
    local_24 = local_24 + -1;
  }
  while( true ) {
    bVar8 = false;
    if (3 < local_24) {
      bVar2 = conv_ascii2bin(local_20[local_24 + -1],local_50);
      bVar8 = (bVar2 | 0x13) == 0xf3;
    }
    if (!bVar8) break;
    local_24 = local_24 + -1;
  }
  if (local_24 % 4 == 0) {
    local_18 = in_RSI;
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 4) {
      bVar2 = conv_ascii2bin(*local_20,local_50);
      bVar3 = conv_ascii2bin(local_20[1],local_50);
      puVar6 = local_20 + 3;
      bVar4 = conv_ascii2bin(local_20[2],local_50);
      local_20 = local_20 + 4;
      bVar5 = conv_ascii2bin(*puVar6,local_50);
      if (((((bVar2 & 0x80) != 0) || ((bVar3 & 0x80) != 0)) || ((bVar4 & 0x80) != 0)) ||
         ((bVar5 & 0x80) != 0)) {
        return -1;
      }
      *local_18 = (byte)((ulong)((long)(int)(uint)bVar2 << 0x12) >> 0x10) |
                  (byte)((ulong)((long)(int)(uint)bVar3 << 0xc) >> 0x10);
      pbVar7 = local_18 + 2;
      local_18[1] = (byte)((ulong)((long)(int)(uint)bVar3 << 0xc) >> 8) |
                    (byte)((ulong)((long)(int)(uint)bVar4 << 6) >> 8);
      local_18 = local_18 + 3;
      *pbVar7 = (byte)((long)(int)(uint)bVar4 << 6) | bVar5;
      local_2c = local_2c + 3;
    }
    local_4 = local_2c;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int evp_decodeblock_int(EVP_ENCODE_CTX *ctx, unsigned char *t,
                               const unsigned char *f, int n)
{
    int i, ret = 0, a, b, c, d;
    unsigned long l;
    const unsigned char *table;

    if (ctx != NULL && (ctx->flags & EVP_ENCODE_CTX_USE_SRP_ALPHABET) != 0)
        table = srpdata_ascii2bin;
    else
        table = data_ascii2bin;

    /* trim whitespace from the start of the line. */
    while ((n > 0) && (conv_ascii2bin(*f, table) == B64_WS)) {
        f++;
        n--;
    }

    /*
     * strip off stuff at the end of the line ascii2bin values B64_WS,
     * B64_EOLN, B64_EOLN and B64_EOF
     */
    while ((n > 3) && (B64_NOT_BASE64(conv_ascii2bin(f[n - 1], table))))
        n--;

    if (n % 4 != 0)
        return -1;

    for (i = 0; i < n; i += 4) {
        a = conv_ascii2bin(*(f++), table);
        b = conv_ascii2bin(*(f++), table);
        c = conv_ascii2bin(*(f++), table);
        d = conv_ascii2bin(*(f++), table);
        if ((a & 0x80) || (b & 0x80) || (c & 0x80) || (d & 0x80))
            return -1;
        l = ((((unsigned long)a) << 18L) |
             (((unsigned long)b) << 12L) |
             (((unsigned long)c) << 6L) | (((unsigned long)d)));
        *(t++) = (unsigned char)(l >> 16L) & 0xff;
        *(t++) = (unsigned char)(l >> 8L) & 0xff;
        *(t++) = (unsigned char)(l) & 0xff;
        ret += 3;
    }
    return ret;
}